

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

base_t * duckdb_je_base_new(tsdn_t *tsdn,uint ind,extent_hooks_t *extent_hooks,
                           _Bool metadata_use_hooks)

{
  _Bool _Var1;
  base_block_t *pbVar2;
  base_t *ehooks;
  undefined7 in_register_00000009;
  long lVar3;
  size_t *pind_last_00;
  size_t size;
  extent_hooks_t *extent_hooks_00;
  undefined4 uStack_60;
  pszind_t pind_last;
  tsdn_t *local_58;
  size_t duckdb_je_extent_sn_next;
  size_t gap_size;
  ehooks_t fake_ehooks;
  
  pind_last = 0;
  duckdb_je_extent_sn_next = 0;
  extent_hooks_00 = extent_hooks;
  if ((int)CONCAT71(in_register_00000009,metadata_use_hooks) == 0) {
    extent_hooks_00 = &duckdb_je_ehooks_default_extent_hooks;
  }
  duckdb_je_ehooks_init(&fake_ehooks,extent_hooks_00,ind);
  ehooks = (base_t *)0x0;
  pind_last_00 = &duckdb_je_extent_sn_next;
  size = 0xf68;
  local_58 = tsdn;
  pbVar2 = base_block_alloc(tsdn,(base_t *)0x0,&fake_ehooks,(uint)&pind_last,
                            (pszind_t *)pind_last_00,(size_t *)0xf68,0x10,
                            CONCAT44(pind_last,uStack_60));
  if (pbVar2 != (base_block_t *)0x0) {
    ehooks = (base_t *)base_extent_bump_alloc_helper(&pbVar2->edata,&gap_size,0xf80,0x40);
    duckdb_je_ehooks_init((ehooks_t *)ehooks,extent_hooks,ind);
    duckdb_je_ehooks_init(&ehooks->ehooks_base,extent_hooks_00,ind);
    _Var1 = duckdb_je_malloc_mutex_init
                      (&ehooks->mtx,"base",WITNESS_RANK_BASE,malloc_mutex_rank_exclusive);
    if (_Var1) {
      base_unmap(local_58,&fake_ehooks,(uint)pbVar2,(void *)pbVar2->size,(size_t)pind_last_00);
      ehooks = (base_t *)0x0;
    }
    else {
      ehooks->pind_last = pind_last;
      ehooks->duckdb_je_extent_sn_next = duckdb_je_extent_sn_next;
      ehooks->blocks = pbVar2;
      ehooks->auto_thp_switched = false;
      for (lVar3 = 0xa8; lVar3 != 0xf28; lVar3 = lVar3 + 0x10) {
        duckdb_je_edata_heap_new((edata_heap_t *)((long)&(ehooks->ehooks).ind + lVar3));
      }
      duckdb_je_edata_avail_new(&ehooks->edata_avail);
      ehooks->edata_allocated = 0;
      ehooks->rtree_allocated = 0;
      ehooks->allocated = 0x90;
      ehooks->resident = 0x1000;
      ehooks->mapped = pbVar2->size;
      ehooks->n_thp =
           (ulong)(duckdb_je_opt_metadata_thp == metadata_thp_always &&
                  duckdb_je_init_system_thp_mode == thp_mode_default);
      malloc_mutex_lock(local_58,&ehooks->mtx);
      base_extent_bump_alloc_post
                ((tsdn_t *)ehooks,(base_t *)&pbVar2->edata,(edata_t *)gap_size,(size_t)ehooks,
                 (void *)0xf80,size);
      (ehooks->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(ehooks->mtx).field_0 + 0x48));
    }
  }
  return ehooks;
}

Assistant:

base_t *
base_new(tsdn_t *tsdn, unsigned ind, const extent_hooks_t *extent_hooks,
    bool metadata_use_hooks) {
	pszind_t pind_last = 0;
	size_t extent_sn_next = 0;

	/*
	 * The base will contain the ehooks eventually, but it itself is
	 * allocated using them.  So we use some stack ehooks to bootstrap its
	 * memory, and then initialize the ehooks within the base_t.
	 */
	ehooks_t fake_ehooks;
	ehooks_init(&fake_ehooks, metadata_use_hooks ?
	    (extent_hooks_t *)extent_hooks :
	    (extent_hooks_t *)&ehooks_default_extent_hooks, ind);

	base_block_t *block = base_block_alloc(tsdn, NULL, &fake_ehooks, ind,
	    &pind_last, &extent_sn_next, sizeof(base_t), QUANTUM);
	if (block == NULL) {
		return NULL;
	}

	size_t gap_size;
	size_t base_alignment = CACHELINE;
	size_t base_size = ALIGNMENT_CEILING(sizeof(base_t), base_alignment);
	base_t *base = (base_t *)base_extent_bump_alloc_helper(&block->edata,
	    &gap_size, base_size, base_alignment);
	ehooks_init(&base->ehooks, (extent_hooks_t *)extent_hooks, ind);
	ehooks_init(&base->ehooks_base, metadata_use_hooks ?
	    (extent_hooks_t *)extent_hooks :
	    (extent_hooks_t *)&ehooks_default_extent_hooks, ind);
	if (malloc_mutex_init(&base->mtx, "base", WITNESS_RANK_BASE,
	    malloc_mutex_rank_exclusive)) {
		base_unmap(tsdn, &fake_ehooks, ind, block, block->size);
		return NULL;
	}
	base->pind_last = pind_last;
	base->extent_sn_next = extent_sn_next;
	base->blocks = block;
	base->auto_thp_switched = false;
	for (szind_t i = 0; i < SC_NSIZES; i++) {
		edata_heap_new(&base->avail[i]);
	}
	edata_avail_new(&base->edata_avail);

	if (config_stats) {
		base->edata_allocated = 0;
		base->rtree_allocated = 0;
		base->allocated = sizeof(base_block_t);
		base->resident = PAGE_CEILING(sizeof(base_block_t));
		base->mapped = block->size;
		base->n_thp = (opt_metadata_thp == metadata_thp_always) &&
		    metadata_thp_madvise() ? HUGEPAGE_CEILING(sizeof(base_block_t))
		    >> LG_HUGEPAGE : 0;
		assert(base->allocated <= base->resident);
		assert(base->resident <= base->mapped);
		assert(base->n_thp << LG_HUGEPAGE <= base->mapped);
	}

	/* Locking here is only necessary because of assertions. */
	malloc_mutex_lock(tsdn, &base->mtx);
	base_extent_bump_alloc_post(tsdn, base, &block->edata, gap_size, base,
	    base_size);
	malloc_mutex_unlock(tsdn, &base->mtx);

	return base;
}